

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O3

void printdelem(rnndelem *elem,uint64_t offset)

{
  undefined8 in_RAX;
  FILE *pFVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  bool bVar6;
  int total;
  int len;
  undefined8 local_38;
  
  if ((elem->varinfo).dead == 0) {
    local_38 = in_RAX;
    if (elem->length != 1) {
      if (stridesmax <= stridesnum) {
        iVar4 = stridesmax * 2;
        bVar6 = stridesmax != 0;
        stridesmax = 0x10;
        if (bVar6) {
          stridesmax = iVar4;
        }
        strides = (uint64_t *)realloc(strides,(long)stridesmax << 3);
      }
      lVar2 = (long)stridesnum;
      stridesnum = stridesnum + 1;
      strides[lVar2] = elem->stride;
    }
    if (elem->name != (char *)0x0) {
      if (stridesnum == 0) {
        printdef(elem->fullname,(char *)0x0,0,elem->offset + offset,elem->file);
      }
      else {
        pFVar1 = (FILE *)findfout(elem->file);
        fprintf(pFVar1,"#define %s(%n",elem->fullname,&local_38);
        if (0 < stridesnum) {
          uVar3 = 0;
          do {
            if (uVar3 != 0) {
              fwrite(", ",2,1,pFVar1);
              local_38 = CONCAT44(local_38._4_4_,(int)local_38 + 2);
            }
            fprintf(pFVar1,"i%d%n",(ulong)uVar3,(long)&local_38 + 4);
            local_38 = CONCAT44(local_38._4_4_,(int)local_38 + local_38._4_4_);
            uVar3 = uVar3 + 1;
          } while ((int)uVar3 < stridesnum);
        }
        fputc(0x29,pFVar1);
        iVar4 = (int)local_38 + 1;
        local_38 = CONCAT44(local_38._4_4_,iVar4);
        seekcol((FILE *)pFVar1,iVar4,startcol + -1);
        fprintf(pFVar1,"(0x%08lx",elem->offset + offset);
        if (0 < stridesnum) {
          uVar5 = 0;
          do {
            fprintf(pFVar1," + %#lx*(i%d)",strides[uVar5],uVar5 & 0xffffffff);
            uVar5 = uVar5 + 1;
          } while ((long)uVar5 < (long)stridesnum);
        }
        fwrite(")\n",2,1,pFVar1);
      }
      if (elem->stride != 0) {
        printdef(elem->fullname,"ESIZE",0,elem->stride,elem->file);
      }
      if (elem->length != 1) {
        printdef(elem->fullname,"LEN",0,elem->length,elem->file);
      }
      printtypeinfo(&elem->typeinfo,elem->fullname,0,elem->file);
    }
    pFVar1 = (FILE *)findfout(elem->file);
    fputc(10,pFVar1);
    if (0 < elem->subelemsnum) {
      lVar2 = 0;
      do {
        printdelem(elem->subelems[lVar2],elem->offset + offset);
        lVar2 = lVar2 + 1;
      } while (lVar2 < elem->subelemsnum);
    }
    if (elem->length != 1) {
      stridesnum = stridesnum + -1;
      return;
    }
  }
  return;
}

Assistant:

void printdelem (struct rnndelem *elem, uint64_t offset) {
	if (elem->varinfo.dead)
		return;
	if (elem->length != 1)
		ADDARRAY(strides, elem->stride);
	if (elem->name) {
		if (stridesnum) {
			int len, total;
			FILE *dst = findfout(elem->file);
			fprintf (dst, "#define %s(%n", elem->fullname, &total);
			int i;
			for (i = 0; i < stridesnum; i++) {
				if (i) {
					fprintf(dst, ", ");
					total += 2;
				}
				fprintf (dst, "i%d%n", i, &len);
				total += len;
			}
			fprintf (dst, ")");
			total++;
			seekcol (dst, total, startcol-1);
			fprintf (dst, "(0x%08"PRIx64"", offset + elem->offset);
			for (i = 0; i < stridesnum; i++)
				fprintf (dst, " + %#" PRIx64 "*(i%d)", strides[i], i);
			fprintf (dst, ")\n");
		} else
			printdef (elem->fullname, 0, 0, offset + elem->offset, elem->file);
		if (elem->stride)
			printdef (elem->fullname, "ESIZE", 0, elem->stride, elem->file);
		if (elem->length != 1)
			printdef (elem->fullname, "LEN", 0, elem->length, elem->file);
		printtypeinfo (&elem->typeinfo, elem->fullname, 0, elem->file);
	}
	fprintf (findfout(elem->file), "\n");
	int j;
	for (j = 0; j < elem->subelemsnum; j++) {
		printdelem(elem->subelems[j], offset + elem->offset);
	}
	if (elem->length != 1) stridesnum--;
}